

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O0

SubpassDesc * __thiscall
Diligent::RenderPassBase<Diligent::EngineGLImplTraits>::GetSubpass
          (RenderPassBase<Diligent::EngineGLImplTraits> *this,Uint32 SubpassIndex)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint32 SubpassIndex_local;
  RenderPassBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = SubpassIndex;
  if ((this->
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      ).m_Desc.SubpassCount <= SubpassIndex) {
    FormatString<char[26],char[41]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SubpassIndex < this->m_Desc.SubpassCount",(char (*) [41])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x94);
    std::__cxx11::string::~string((string *)local_38);
  }
  return (this->
         super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
         ).m_Desc.pSubpasses + (uint)msg.field_2._12_4_;
}

Assistant:

const SubpassDesc& GetSubpass(Uint32 SubpassIndex) const
    {
        VERIFY_EXPR(SubpassIndex < this->m_Desc.SubpassCount);
        return this->m_Desc.pSubpasses[SubpassIndex];
    }